

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O0

void __thiscall MDPSolver::Print(MDPSolver *this)

{
  PlanningUnitDecPOMDPDiscrete *this_00;
  State *pSVar1;
  ostream *poVar2;
  JointAction *pJVar3;
  MDPSolver *in_RDI;
  double extraout_XMM0_Qa;
  double dVar4;
  double extraout_XMM0_Qa_00;
  Index jaI_2;
  Index aMax;
  double v;
  double q;
  Index sI_3;
  Index sI_2;
  Index jaI_1;
  Index sI_1;
  Index jaI;
  size_t t;
  Index sI;
  size_t nrJA;
  size_t nrS;
  size_t horizon;
  string *in_stack_fffffffffffffe88;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe90;
  string local_110 [32];
  uint local_f0;
  uint local_ec;
  double local_e8;
  double local_e0;
  string local_d8 [36];
  uint local_b4;
  string local_b0 [32];
  uint local_90;
  uint local_8c;
  string local_88 [32];
  uint local_68;
  uint local_64;
  size_t local_60;
  string local_48 [36];
  uint local_24;
  size_t local_20;
  size_t local_18;
  size_t local_10;
  
  this_00 = GetPU(in_RDI);
  local_10 = PlanningUnit::GetHorizon((PlanningUnit *)this_00);
  GetPU(in_RDI);
  local_18 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffe90);
  GetPU(in_RDI);
  local_20 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x86ea1d);
  std::operator<<((ostream *)&std::cout,"States: ");
  for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
    pSVar1 = PlanningUnitMADPDiscrete::GetState
                       (in_stack_fffffffffffffe90,(Index)((ulong)in_stack_fffffffffffffe88 >> 0x20))
    ;
    (*(pSVar1->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])();
    poVar2 = std::operator<<((ostream *)&std::cout,local_48);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(local_48);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if (local_10 == 999999) {
    for (local_8c = 0; local_8c < local_20; local_8c = local_8c + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Q(:,");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8c);
      dVar4 = extraout_XMM0_Qa_00;
      std::operator<<(poVar2,") =\t");
      for (local_90 = 0; local_90 < local_18; local_90 = local_90 + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout," ");
        (*in_RDI->_vptr_MDPSolver[6])(in_RDI,(ulong)local_90,(ulong)local_8c);
        dVar4 = (double)std::ostream::operator<<(poVar2,dVar4);
      }
      poVar2 = std::operator<<((ostream *)&std::cout," ");
      pJVar3 = PlanningUnitMADPDiscrete::GetJointAction
                         (in_stack_fffffffffffffe90,
                          (Index)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      (*pJVar3->_vptr_JointAction[4])();
      std::operator<<(poVar2,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::operator<<((ostream *)&std::cout,"Policy: ");
    for (local_b4 = 0; local_b4 < local_18; local_b4 = local_b4 + 1) {
      pSVar1 = PlanningUnitMADPDiscrete::GetState
                         (in_stack_fffffffffffffe90,
                          (Index)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      (*(pSVar1->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])();
      poVar2 = std::operator<<((ostream *)&std::cout,local_d8);
      std::operator<<(poVar2,"->");
      std::__cxx11::string::~string(local_d8);
      dVar4 = -1.79769313486232e+308;
      local_e8 = -1.79769313486232e+308;
      local_ec = 0x7fffffff;
      for (local_f0 = 0; local_f0 < local_20; local_f0 = local_f0 + 1) {
        (*in_RDI->_vptr_MDPSolver[6])(in_RDI,(ulong)local_b4,(ulong)local_f0);
        if (local_e8 < dVar4) {
          local_ec = local_f0;
          local_e8 = dVar4;
        }
        local_e0 = dVar4;
      }
      pJVar3 = PlanningUnitMADPDiscrete::GetJointAction
                         (in_stack_fffffffffffffe90,
                          (Index)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      in_stack_fffffffffffffe88 = local_110;
      (*pJVar3->_vptr_JointAction[4])();
      in_stack_fffffffffffffe90 =
           (PlanningUnitMADPDiscrete *)
           std::operator<<((ostream *)&std::cout,in_stack_fffffffffffffe88);
      std::operator<<((ostream *)in_stack_fffffffffffffe90," ");
      std::__cxx11::string::~string(local_110);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_60 = 0; local_60 != local_10; local_60 = local_60 + 1) {
      for (local_64 = 0; local_64 < local_20; local_64 = local_64 + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Q(t=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
        poVar2 = std::operator<<(poVar2,",:,");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_64);
        dVar4 = extraout_XMM0_Qa;
        std::operator<<(poVar2,") =\t");
        for (local_68 = 0; local_68 < local_18; local_68 = local_68 + 1) {
          poVar2 = std::operator<<((ostream *)&std::cout," ");
          (*in_RDI->_vptr_MDPSolver[5])
                    (in_RDI,local_60 & 0xffffffff,(ulong)local_68,(ulong)local_64);
          dVar4 = (double)std::ostream::operator<<(poVar2,dVar4);
        }
        poVar2 = std::operator<<((ostream *)&std::cout," ");
        pJVar3 = PlanningUnitMADPDiscrete::GetJointAction
                           (in_stack_fffffffffffffe90,
                            (Index)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        (*pJVar3->_vptr_JointAction[4])();
        std::operator<<(poVar2,local_88);
        std::__cxx11::string::~string(local_88);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void MDPSolver::Print() const
{
    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    cout << "States: ";
    for(Index sI = 0; sI < nrS; sI++)
        cout << _m_pu->GetState(sI)->SoftPrintBrief() << " ";
    cout << endl;
        
    if(horizon!=MAXHORIZON)
    {
        for(size_t t = 0; t!=horizon; t++)
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {            
                cout << "Q(t=" << t << ",:," << jaI << ") =\t";
                for(Index sI = 0; sI < nrS; sI++)
                    cout << " " << GetQ(t,sI,jaI);
                cout << " " << _m_pu->GetJointAction(jaI)->SoftPrintBrief();
                cout << endl;
            }
    }
    else
    {
        for(Index jaI = 0; jaI < nrJA; jaI++)
        {            
            cout << "Q(:," << jaI << ") =\t";
            for(Index sI = 0; sI < nrS; sI++)
                cout << " " << GetQ(sI,jaI);
            cout << " " << _m_pu->GetJointAction(jaI)->SoftPrintBrief();
            cout << endl;
        }
        
        cout << "Policy: ";
        for(Index sI = 0; sI < nrS; sI++)
        {
            cout << _m_pu->GetState(sI)->SoftPrintBrief() << "->";
            double q,v=-DBL_MAX;
            Index aMax=INT_MAX;

            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                q=GetQ(sI,jaI);
                if(q>v)
                {
                    v=q;
                    aMax=jaI;
                }
            }
            cout << _m_pu->GetJointAction(aMax)->SoftPrintBrief() << " ";
        }
        cout << endl;
    }
}